

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_tests.cpp
# Opt level: O1

void __thiscall
iu_AssertionTest_x_iutest_x_Pred4_Test::Body(iu_AssertionTest_x_iutest_x_Pred4_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  allocator<char> local_201;
  AssertionResult iutest_ar;
  _Alloc_hider local_1d8;
  _func_bool_int_int_int_int *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 uStack_1c4;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  undefined1 local_1a8 [392];
  
  iutest::AssertPred4Helper<bool(*)(int,int,int,int),int,int,int,int>
            ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest4,(char *)0x254e78,
             in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe48,in_stack_fffffffffffffe50);
  bVar2 = iutest_ar.m_result;
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,iutest_ar.m_message._M_dataplus._M_p,&local_201);
    in_stack_fffffffffffffe48 = 0x336039;
    in_stack_fffffffffffffe50 = 0x2f;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1d8,(Fixed *)local_1a8,false);
    if (local_1d8._M_p != &stack0xfffffffffffffe38) {
      operator_delete(local_1d8._M_p,CONCAT44(uStack_1c4,in_stack_fffffffffffffe38) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  paVar1 = &iutest_ar.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                    iutest_ar.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    iutest::AssertPred4Helper<bool(*)(int,int,int,int),int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest4,(char *)0x254f7e,
               in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe48,in_stack_fffffffffffffe50);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,iutest_ar.m_message._M_dataplus._M_p,&local_201);
      in_stack_fffffffffffffe48 = 0x336039;
      in_stack_fffffffffffffe50 = 0x30;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1d8,(Fixed *)local_1a8,false);
      if (local_1d8._M_p != &stack0xfffffffffffffe38) {
        operator_delete(local_1d8._M_p,CONCAT44(uStack_1c4,in_stack_fffffffffffffe38) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::AssertPred4Helper<bool(*)(int,int,int,int),int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest4,(char *)0x255074,
               in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe48,in_stack_fffffffffffffe50);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,iutest_ar.m_message._M_dataplus._M_p,&local_201);
      in_stack_fffffffffffffe48 = 0x336039;
      in_stack_fffffffffffffe50 = 0x31;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1d8,(Fixed *)local_1a8,false);
      if (local_1d8._M_p != &stack0xfffffffffffffe38) {
        operator_delete(local_1d8._M_p,CONCAT44(uStack_1c4,in_stack_fffffffffffffe38) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::AssertPred4Helper<bool(*)(int,int,int,int),int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest4,(char *)0x25516a,
               in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe48,in_stack_fffffffffffffe50);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,iutest_ar.m_message._M_dataplus._M_p,&local_201);
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1d8,(Fixed *)local_1a8,false);
      if (local_1d8._M_p != &stack0xfffffffffffffe38) {
        operator_delete(local_1d8._M_p,CONCAT44(uStack_1c4,in_stack_fffffffffffffe38) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

IUTEST(AssertionTest, Pred4)
{
    IUTEST_ASSERT_PRED4(PredTest4, 0, 1, 2, 3);
    IUTEST_EXPECT_PRED4(PredTest4, 0, 1, 2, 3);
    IUTEST_INFORM_PRED4(PredTest4, 0, 1, 2, 3);
    IUTEST_ASSUME_PRED4(PredTest4, 0, 1, 2, 3);
}